

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

void ReparseTagDecls(TidyDocImpl *doc,uint changedUserTags)

{
  if ((changedUserTags & 2) != 0) {
    prvTidyFreeDeclaredTags(doc,tagtype_inline);
    ReparseTagType(doc,TidyInlineTags);
  }
  if ((changedUserTags & 4) != 0) {
    prvTidyFreeDeclaredTags(doc,tagtype_block);
    ReparseTagType(doc,TidyBlockTags);
  }
  if ((changedUserTags & 1) != 0) {
    prvTidyFreeDeclaredTags(doc,tagtype_empty);
    ReparseTagType(doc,TidyEmptyTags);
  }
  if ((changedUserTags & 8) == 0) {
    return;
  }
  prvTidyFreeDeclaredTags(doc,tagtype_pre);
  ReparseTagType(doc,TidyPreTags);
  return;
}

Assistant:

static void ReparseTagDecls( TidyDocImpl* doc, uint changedUserTags  )
{
#define REPARSE_USERTAGS(USERTAGOPTION,USERTAGTYPE) \
    if ( changedUserTags & USERTAGTYPE ) \
    { \
        TY_(FreeDeclaredTags)( doc, USERTAGTYPE ); \
        ReparseTagType( doc, USERTAGOPTION ); \
    }
    REPARSE_USERTAGS(TidyInlineTags,tagtype_inline);
    REPARSE_USERTAGS(TidyBlockTags,tagtype_block);
    REPARSE_USERTAGS(TidyEmptyTags,tagtype_empty);
    REPARSE_USERTAGS(TidyPreTags,tagtype_pre);
}